

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_fpu_helper.c
# Opt level: O2

void vflr64(S390Vector *v1,S390Vector *v2,CPUS390XState_conflict *env,_Bool s,_Bool XxC,uint8_t erm,
           uintptr_t retaddr)

{
  uint8_t vxc;
  float32 fVar1;
  undefined7 in_register_00000009;
  long lVar2;
  undefined3 in_register_00000089;
  S390Vector tmp;
  uint8_t local_59;
  int local_58;
  undefined4 local_54;
  S390Vector *local_50;
  undefined8 local_48;
  uint64_t uStack_40;
  
  local_54 = (undefined4)CONCAT71(in_register_00000009,s);
  local_59 = '\0';
  local_48 = 0;
  uStack_40 = 0;
  local_50 = v1;
  local_58 = s390_swap_bfp_rounding_mode(env,CONCAT31(in_register_00000089,erm));
  lVar2 = 0;
  while (lVar2 != 2) {
    fVar1 = float64_to_float32_s390x(v2->doubleword[lVar2],&env->fpu_status);
    *(float32 *)((long)&local_48 + lVar2 * 8 + 4) = fVar1;
    vxc = check_ieee_exc(env,(uint8_t)lVar2,XxC,&local_59);
    if (((char)local_54 != '\0') || (lVar2 = lVar2 + 1, vxc != '\0')) goto LAB_00b009bc;
  }
  vxc = '\0';
LAB_00b009bc:
  s390_restore_bfp_rounding_mode(env,local_58);
  handle_ieee_exc(env,vxc,local_59,retaddr);
  local_50->doubleword[0] = local_48;
  local_50->doubleword[1] = uStack_40;
  return;
}

Assistant:

static void vflr64(S390Vector *v1, const S390Vector *v2, CPUS390XState *env,
                   bool s, bool XxC, uint8_t erm, uintptr_t retaddr)
{
    uint8_t vxc, vec_exc = 0;
    S390Vector tmp = { 0 };
    int i, old_mode;

    old_mode = s390_swap_bfp_rounding_mode(env, erm);
    for (i = 0; i < 2; i++) {
        float64 a = s390_vec_read_element64(v2, i);
        uint32_t ret = float64_to_float32(a, &env->fpu_status);

        /* place at even element */
        s390_vec_write_element32(&tmp, i * 2, ret);
        /* indicate the source element */
        vxc = check_ieee_exc(env, i, XxC, &vec_exc);
        if (s || vxc) {
            break;
        }
    }
    s390_restore_bfp_rounding_mode(env, old_mode);
    handle_ieee_exc(env, vxc, vec_exc, retaddr);
    *v1 = tmp;
}